

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall PKCS12Test_TestEmptyPassword_Test::TestBody(PKCS12Test_TestEmptyPassword_Test *this)

{
  bool bVar1;
  int iVar2;
  stack_st_X509 *__p;
  char *pcVar3;
  pointer out_certs;
  char *in_R9;
  undefined1 auVar4 [16];
  Span<const_unsigned_char> SVar5;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_168 [8];
  CBS pkcs12;
  EVP_PKEY *key;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  UniquePtr<struct_stack_st_X509> certs;
  string local_a0;
  undefined1 local_80 [16];
  Span<const_unsigned_char> local_70;
  undefined1 local_50 [16];
  Span<const_unsigned_char> local_40;
  undefined1 local_30 [8];
  string data;
  PKCS12Test_TestEmptyPassword_Test *this_local;
  
  data.field_2._8_8_ = this;
  GetTestData_abi_cxx11_((string *)local_30,"crypto/pkcs8/test/empty_password.p12");
  local_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s._M_str = local_50._8_8_;
  s._M_len = (size_t)s._M_str;
  local_40 = bssl::StringAsBytes(local_50._0_8_,s);
  TestImpl("EmptyPassword (empty password)",local_40,"",(char *)0x0);
  local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s_00._M_str = local_80._8_8_;
  s_00._M_len = (size_t)s_00._M_str;
  local_70 = bssl::StringAsBytes(local_80._0_8_,s_00);
  TestImpl("EmptyPassword (null password)",local_70,(char *)0x0,(char *)0x0);
  GetTestData_abi_cxx11_(&local_a0,"crypto/pkcs8/test/empty_password_ber.p12");
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s_01._M_str = auVar4._8_8_;
  s_01._M_len = (size_t)s_01._M_str;
  SVar5 = bssl::StringAsBytes(auVar4._0_8_,s_01);
  TestImpl("EmptyPassword (BER, empty password)",SVar5,"",(char *)0x0);
  auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s_02._M_str = auVar4._8_8_;
  s_02._M_len = (size_t)s_02._M_str;
  SVar5 = bssl::StringAsBytes(auVar4._0_8_,s_02);
  TestImpl("EmptyPassword (BER, null password)",SVar5,(char *)0x0,(char *)0x0);
  GetTestData_abi_cxx11_((string *)&certs,"crypto/pkcs8/test/empty_password_ber_nested.p12");
  std::__cxx11::string::operator=((string *)local_30,(string *)&certs);
  std::__cxx11::string::~string((string *)&certs);
  __p = sk_X509_new_null();
  std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
  testing::AssertionResult::AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
            ((AssertionResult *)local_118,
             (unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_148,(internal *)local_118,(AssertionResult *)0x8ba81c,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  if (bVar1) {
    pkcs12.len = 0;
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    s_03._M_str = auVar4._8_8_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = auVar4._0_8_;
    s_03._M_len = (size_t)s_03._M_str;
    SVar5 = bssl::StringAsBytes((bssl *)gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,s_03);
    cbs_st::cbs_st((cbs_st *)local_168,SVar5);
    out_certs = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                          ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar_.message_
                          );
    iVar2 = PKCS12_get_key_and_certs((EVP_PKEY **)&pkcs12.len,out_certs,(CBS *)local_168,"");
    local_199 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_198,&local_199,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1d0,(internal *)local_198,
                 (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, \"\")",
                 "true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x9f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      testing::Message::~Message(&local_1a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  }
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(PKCS12Test, TestEmptyPassword) {
  // Generated with
  //   openssl pkcs12 -export -inkey ecdsa_p256_key.pem -in ecdsa_p256_cert.pem -password pass:  
  std::string data = GetTestData("crypto/pkcs8/test/empty_password.p12");
  TestImpl("EmptyPassword (empty password)", bssl::StringAsBytes(data), "",
           nullptr);
  TestImpl("EmptyPassword (null password)", bssl::StringAsBytes(data), nullptr,
           nullptr);

  // The above input, modified to have a constructed string.
  data = GetTestData("crypto/pkcs8/test/empty_password_ber.p12");
  TestImpl("EmptyPassword (BER, empty password)", bssl::StringAsBytes(data), "",
           nullptr);
  TestImpl("EmptyPassword (BER, null password)", bssl::StringAsBytes(data),
           nullptr, nullptr);

  // The constructed string with too much recursion.
  data = GetTestData("crypto/pkcs8/test/empty_password_ber_nested.p12");
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);
  EVP_PKEY *key = nullptr;
  CBS pkcs12 = bssl::StringAsBytes(data);
  EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, ""));
}